

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

EndpointObject * anon_unknown.dwarf_8bada::verifyEndpoint(HelicsEndpoint ept,HelicsError *err)

{
  EndpointObject *pEVar1;
  bool bVar2;
  
  if (err == (HelicsError *)0x0) {
    if (ept == (HelicsEndpoint)0x0) {
      return (EndpointObject *)0x0;
    }
  }
  else {
    if (err->error_code != 0) {
      return (EndpointObject *)0x0;
    }
    if (ept == (HelicsEndpoint)0x0) goto LAB_00187dae;
  }
  bVar2 = *(int *)((long)ept + 0x20) == -0x4bac6b3e;
  pEVar1 = (EndpointObject *)0x0;
  if (bVar2) {
    pEVar1 = (EndpointObject *)ept;
  }
  if (bVar2 || err == (HelicsError *)0x0) {
    return pEVar1;
  }
LAB_00187dae:
  err->error_code = -3;
  err->message = "The given endpoint does not point to a valid object";
  return (EndpointObject *)0x0;
}

Assistant:

helics::EndpointObject* verifyEndpoint(HelicsEndpoint ept, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    auto* endObj = reinterpret_cast<helics::EndpointObject*>(ept);
    if (endObj == nullptr || endObj->valid != EndpointValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidEndpoint);
        return nullptr;
    }
    return endObj;
}